

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O1

StackSym * __thiscall GlobOpt::GetTaggedIntConstantStackSym(GlobOpt *this,int32 intConstantValue)

{
  IntConstantToStackSymMap *pIVar1;
  Type piVar2;
  uint uVar3;
  StackSym *pSVar4;
  Type this_00;
  uint uVar5;
  
  pIVar1 = this->intConstantToStackSymMap;
  piVar2 = pIVar1->buckets;
  uVar3 = 0;
  if (piVar2 != (Type)0x0) {
    uVar3 = JsUtil::
            BaseDictionary<long,_StackSym_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::GetBucket(intConstantValue * 2 + 1,pIVar1->bucketCount,pIVar1->modFunctionIndex);
    uVar5 = piVar2[uVar3];
    uVar3 = 0;
    if (-1 < (int)uVar5) {
      uVar3 = 0;
      do {
        if (pIVar1->entries[uVar5].
            super_DefaultHashedEntry<long,_StackSym_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
            .super_KeyValueEntry<long,_StackSym_*>.
            super_ValueEntry<StackSym_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<long,_StackSym_*>_>
            .super_KeyValueEntryDataLayout2<long,_StackSym_*>.key == (long)intConstantValue) {
          this_00 = pIVar1->stats;
          goto LAB_00459776;
        }
        uVar3 = uVar3 + 1;
        uVar5 = pIVar1->entries[uVar5].
                super_DefaultHashedEntry<long,_StackSym_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                .super_KeyValueEntry<long,_StackSym_*>.
                super_ValueEntry<StackSym_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<long,_StackSym_*>_>
                .super_KeyValueEntryDataLayout2<long,_StackSym_*>.next;
      } while (-1 < (int)uVar5);
    }
  }
  this_00 = pIVar1->stats;
  uVar5 = 0xffffffff;
LAB_00459776:
  if (this_00 != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(this_00,uVar3);
  }
  if ((int)uVar5 < 0) {
    pSVar4 = (StackSym *)0x0;
  }
  else {
    pSVar4 = pIVar1->entries[uVar5].
             super_DefaultHashedEntry<long,_StackSym_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
             .super_KeyValueEntry<long,_StackSym_*>.
             super_ValueEntry<StackSym_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<long,_StackSym_*>_>
             .super_KeyValueEntryDataLayout2<long,_StackSym_*>.value;
  }
  return pSVar4;
}

Assistant:

StackSym *GlobOpt::GetTaggedIntConstantStackSym(const int32 intConstantValue) const
{
    Assert(!Js::TaggedInt::IsOverflow(intConstantValue));

    return intConstantToStackSymMap->Lookup(intConstantValue, nullptr);
}